

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::IndexTableSegment::Dump(IndexTableSegment *this,FILE *stream)

{
  pointer pIVar1;
  pointer pIVar2;
  char *pcVar3;
  ulong uVar4;
  char identbuf [128];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,stream);
  pcVar3 = Rational::EncodeString(&this->IndexEditRate,identbuf,0x80);
  fprintf((FILE *)stream,"  IndexEditRate      = %s\n",pcVar3);
  pcVar3 = i64sz(this->IndexStartPosition,identbuf);
  fprintf((FILE *)stream,"  IndexStartPosition = %s\n",pcVar3);
  pcVar3 = i64sz(this->IndexDuration,identbuf);
  fprintf((FILE *)stream,"  IndexDuration      = %s\n",pcVar3);
  fprintf((FILE *)stream,"  EditUnitByteCount  = %u\n",(ulong)this->EditUnitByteCount);
  fprintf((FILE *)stream,"  IndexSID           = %u\n",(ulong)this->IndexSID);
  fprintf((FILE *)stream,"  BodySID            = %u\n",(ulong)this->BodySID);
  fprintf((FILE *)stream,"  SliceCount         = %hhu\n",(ulong)this->SliceCount);
  fprintf((FILE *)stream,"  PosTableCount      = %hhu\n",(ulong)this->PosTableCount);
  fwrite("  DeltaEntryArray:\n",0x13,1,(FILE *)stream);
  FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
  ::Dump(&(this->DeltaEntryArray).
          super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
         ,stream,0);
  pIVar1 = (this->IndexEntryArray).
           super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
           .
           super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
           .
           super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->IndexEntryArray).
           super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
           .
           super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
           .
           super__Vector_base<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar1 == pIVar2) {
    fwrite("  IndexEntryArray: NO ENTRIES\n",0x1e,1,(FILE *)stream);
  }
  else {
    uVar4 = ((long)pIVar2 - (long)pIVar1) / 0x18;
    if (uVar4 < 1000) {
      fwrite("  IndexEntryArray:\n",0x13,1,(FILE *)stream);
      FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
      ::Dump(&(this->IndexEntryArray).
              super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
             ,stream,0);
    }
    else {
      fprintf((FILE *)stream,"  IndexEntryArray: %lu entries\n",uVar4);
    }
  }
  return;
}

Assistant:

void
ASDCP::MXF::IndexTableSegment::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  IndexEditRate      = %s\n",  IndexEditRate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  IndexStartPosition = %s\n",  i64sz(IndexStartPosition, identbuf));
  fprintf(stream, "  IndexDuration      = %s\n",  i64sz(IndexDuration, identbuf));
  fprintf(stream, "  EditUnitByteCount  = %u\n",  EditUnitByteCount);
  fprintf(stream, "  IndexSID           = %u\n",  IndexSID);
  fprintf(stream, "  BodySID            = %u\n",  BodySID);
  fprintf(stream, "  SliceCount         = %hhu\n", SliceCount);
  fprintf(stream, "  PosTableCount      = %hhu\n", PosTableCount);

  fprintf(stream, "  DeltaEntryArray:\n");  DeltaEntryArray.Dump(stream);

  if ( IndexEntryArray.empty() )
    {
      fprintf(stream, "  IndexEntryArray: NO ENTRIES\n");
    }
  else if ( IndexEntryArray.size() < 1000 )
    {
      fprintf(stream, "  IndexEntryArray:\n");
      IndexEntryArray.Dump(stream);
    }
  else
    {
      fprintf(stream, "  IndexEntryArray: %lu entries\n", IndexEntryArray.size());
    }
}